

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall
r_exec::View::View(View *this,SyncMode sync,uint64_t ijt,double sln,int64_t res,Code *destination,
                  Code *origin,Code *object)

{
  Atom *this_00;
  Atom local_50 [16];
  Code *local_40;
  Code *origin_local;
  Code *destination_local;
  int64_t res_local;
  double sln_local;
  uint64_t ijt_local;
  View *pVStack_10;
  SyncMode sync_local;
  View *this_local;
  
  local_40 = origin;
  origin_local = destination;
  destination_local = (Code *)res;
  res_local = (int64_t)sln;
  sln_local = (double)ijt;
  ijt_local._4_4_ = sync;
  pVStack_10 = this;
  r_code::View::View(&this->super_View);
  (this->super_View).super__Object._vptr__Object = (_func_int **)&PTR__View_002ed5f8;
  core::P<r_exec::Controller>::P(&this->controller,(Controller *)0x0);
  std::mutex::mutex(&this->m_groupMutex);
  r_code::Atom::SSet((ushort)local_50,(uchar)Opcodes::View);
  this_00 = r_code::View::code(&this->super_View,0);
  r_code::Atom::operator=(this_00,local_50);
  r_code::Atom::~Atom(local_50);
  init(this,(EVP_PKEY_CTX *)(ulong)ijt_local._4_4_);
  return;
}

Assistant:

View::View(SyncMode sync,
           uint64_t ijt,
           double sln,
           int64_t res,
           Code *destination,
           Code *origin,
           Code *object): r_code::View(), controller(nullptr)
{
    code(VIEW_OPCODE) = Atom::SSet(Opcodes::View, VIEW_ARITY);
    init(sync, ijt, sln, res, destination, origin, object);
}